

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ParseField
          (ParserImpl *this,FieldDescriptor *field,Message *output)

{
  CppType CVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool local_41;
  bool local_21;
  bool suc;
  Message *output_local;
  FieldDescriptor *field_local;
  ParserImpl *this_local;
  
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 == CPPTYPE_MESSAGE) {
    iVar2 = (*(output->super_MessageLite)._vptr_MessageLite[0x12])();
    local_21 = ConsumeFieldMessage(this,output,(Reflection *)CONCAT44(extraout_var,iVar2),field);
  }
  else {
    iVar2 = (*(output->super_MessageLite)._vptr_MessageLite[0x12])();
    local_21 = ConsumeFieldValue(this,output,(Reflection *)CONCAT44(extraout_var_00,iVar2),field);
  }
  local_41 = false;
  if (local_21 != false) {
    local_41 = LookingAtType(this,TYPE_END);
  }
  return local_41;
}

Assistant:

bool ParseField(const FieldDescriptor* field, Message* output) {
    bool suc;
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      suc = ConsumeFieldMessage(output, output->GetReflection(), field);
    } else {
      suc = ConsumeFieldValue(output, output->GetReflection(), field);
    }
    return suc && LookingAtType(io::Tokenizer::TYPE_END);
  }